

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O1

_Bool curses_are_equal(object *obj1,object *obj2)

{
  curse_data *pcVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  pcVar1 = obj1->curses;
  if (pcVar1 == (curse_data *)0x0) {
    if (obj2->curses == (curse_data *)0x0) {
      return true;
    }
  }
  else {
    if (obj2->curses == (curse_data *)0x0) {
      return false;
    }
    if (pcVar1 != (curse_data *)0x0) goto LAB_00189091;
  }
  if (obj2->curses != (curse_data *)0x0) {
    return false;
  }
LAB_00189091:
  if ((ulong)z_info->curse_max == 0) {
    return true;
  }
  lVar2 = 0;
  do {
    bVar3 = pcVar1[lVar2].power == obj2->curses[lVar2].power;
    if (!bVar3) {
      return bVar3;
    }
    bVar4 = (ulong)z_info->curse_max - 1 != lVar2;
    lVar2 = lVar2 + 1;
  } while (bVar4);
  return bVar3;
}

Assistant:

bool curses_are_equal(const struct object *obj1, const struct object *obj2)
{
	int i;

	if (!obj1->curses && !obj2->curses) return true;
	if (obj1->curses && !obj2->curses) return false;
	if (!obj1->curses && obj2->curses) return false;

	for (i = 0; i < z_info->curse_max; i++) {
		if (obj1->curses[i].power != obj2->curses[i].power) return false;
	}

	return true;
}